

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int reduce_f3_up(vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  vrna_ud_t *pvVar4;
  code *pcVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  int local_68;
  undefined1 *sc_red_ext;
  vrna_ud_t *domains_up;
  int *f3;
  int local_40;
  int en;
  int e;
  int length;
  int k;
  int u;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  uVar1 = fc->length;
  piVar3 = (fc->matrices->field_2).field_0.f5;
  pvVar4 = fc->domains_up;
  local_40 = 10000000;
  pcVar5 = (code *)sc_wrapper->red_ext;
  if (((piVar3[i + 1] != 10000000) &&
      (uVar6 = (*evaluate)(i,uVar1,i + 1,uVar1,'\f',hc_dat_local), uVar6 != '\0')) &&
     (local_40 = piVar3[i + 1], pcVar5 != (code *)0x0)) {
    iVar7 = (*pcVar5)(i,i + 1,uVar1,sc_wrapper);
    local_40 = iVar7 + local_40;
  }
  if ((pvVar4 != (vrna_ud_t *)0x0) && (pvVar4->energy_cb != (vrna_callback_ud_energy *)0x0)) {
    for (e = 0; e < pvVar4->uniq_motif_count; e = e + 1) {
      uVar2 = pvVar4->uniq_motif_size[e];
      if ((((int)(i + uVar2 + -1) <= (int)uVar1) && (piVar3[(int)(i + uVar2)] != 10000000)) &&
         (uVar6 = (*evaluate)(i,uVar1,i + uVar2 + -1,uVar1,'\f',hc_dat_local), uVar6 != '\0')) {
        iVar7 = piVar3[(int)(i + uVar2)];
        iVar8 = (*pvVar4->energy_cb)(fc,i,i + uVar2 + -1,0x11,pvVar4->data);
        f3._4_4_ = iVar7 + iVar8;
        if (pcVar5 != (code *)0x0) {
          iVar7 = (*pcVar5)(i,i + uVar2,uVar1,sc_wrapper);
          f3._4_4_ = iVar7 + f3._4_4_;
        }
        if (local_40 < f3._4_4_) {
          local_68 = local_40;
        }
        else {
          local_68 = f3._4_4_;
        }
        local_40 = local_68;
      }
    }
  }
  return local_40;
}

Assistant:

int
reduce_f3_up(vrna_fold_compound_t       *fc,
             int                        i,
             vrna_callback_hc_evaluate  *evaluate,
             struct default_data        *hc_dat_local,
             struct sc_wrapper_f3       *sc_wrapper)
{
  int                 u, k, length, e, en, *f3;
  vrna_ud_t           *domains_up;
  sc_f3_reduce_to_ext *sc_red_ext;

  length      = (int)fc->length;
  f3          = fc->matrices->f3_local;
  domains_up  = fc->domains_up;
  e           = INF;

  sc_red_ext = sc_wrapper->red_ext;

  /* check for 3' extension with one unpaired nucleotide */
  if (f3[i + 1] != INF) {
    if (evaluate(i, length, i + 1, length, VRNA_DECOMP_EXT_EXT, hc_dat_local)) {
      e = f3[i + 1];

      if (sc_red_ext)
        e += sc_red_ext(i, i + 1, length, sc_wrapper);
    }
  }

  if ((domains_up) && (domains_up->energy_cb)) {
    for (k = 0; k < domains_up->uniq_motif_count; k++) {
      u = domains_up->uniq_motif_size[k];
      if ((i + u - 1 <= length) && (f3[i + u] != INF)) {
        if (evaluate(i, length, i + u - 1, length, VRNA_DECOMP_EXT_EXT, hc_dat_local)) {
          en = f3[i + u] +
               domains_up->energy_cb(fc,
                                     i,
                                     i + u - 1,
                                     VRNA_UNSTRUCTURED_DOMAIN_EXT_LOOP | VRNA_UNSTRUCTURED_DOMAIN_MOTIF,
                                     domains_up->data);

          if (sc_red_ext)
            en += sc_red_ext(i, i + u, length, sc_wrapper);

          e = MIN2(e, en);
        }
      }
    }
  }

  return e;
}